

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml::cpu::aarch64::gemv<block_q4_0,8l,8l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  int64_t x;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  uVar7 = (ulong)nr;
  auVar12[8] = 0xf;
  auVar12._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar12[9] = 0xf;
  auVar12[10] = 0xf;
  auVar12[0xb] = 0xf;
  auVar12[0xc] = 0xf;
  auVar12[0xd] = 0xf;
  auVar12[0xe] = 0xf;
  auVar12[0xf] = 0xf;
  auVar12[0x10] = 0xf;
  auVar12[0x11] = 0xf;
  auVar12[0x12] = 0xf;
  auVar12[0x13] = 0xf;
  auVar12[0x14] = 0xf;
  auVar12[0x15] = 0xf;
  auVar12[0x16] = 0xf;
  auVar12[0x17] = 0xf;
  auVar12[0x18] = 0xf;
  auVar12[0x19] = 0xf;
  auVar12[0x1a] = 0xf;
  auVar12[0x1b] = 0xf;
  auVar12[0x1c] = 0xf;
  auVar12[0x1d] = 0xf;
  auVar12[0x1e] = 0xf;
  auVar12[0x1f] = 0xf;
  auVar13._16_16_ = _DAT_00146f40;
  auVar13._0_16_ = _DAT_00146f40;
  vmovdqa64_avx512vl(_DAT_00146f30);
  auVar10 = vpmovsxbd_avx512vl(ZEXT816(0xe060c040a020800));
  auVar16 = vpmovsxbd_avx2(ZEXT816(0xf070d050b030901));
  uVar5 = (ulong)(n / 0x20);
  uVar6 = 0;
  do {
    if (uVar6 == (~((long)uVar7 >> 0x3f) & uVar7)) {
      return;
    }
    pauVar8 = (undefined1 (*) [32])((long)vx + 0x70);
    uVar9 = 0;
    while (uVar9 != (uint)(~(nc / 8 >> 0x1f) & nc / 8)) {
      if ((~((long)uVar5 >> 0x3f) & uVar5) * 0x90 != 0) {
        uVar1 = *(undefined4 *)((long)vy + 2);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar14._16_4_ = uVar1;
        auVar14._20_4_ = uVar1;
        auVar14._24_4_ = uVar1;
        auVar14._28_4_ = uVar1;
        auVar2 = vpand_avx2(pauVar8[-3],auVar12);
        auVar15 = vpsrlw_avx2(pauVar8[-3],4);
        auVar3 = vpshufb_avx2(auVar13,auVar2);
        auVar2 = vpand_avx2(pauVar8[-2],auVar12);
        auVar15 = vpand_avx2(auVar15,auVar12);
        auVar4 = vpshufb_avx2(auVar13,auVar2);
        auVar2 = vpand_avx2(pauVar8[-1],auVar12);
        vpshufb_avx2(auVar13,auVar2);
        auVar2 = vpand_avx2(*pauVar8,auVar12);
        auVar11 = vpermt2d_avx512vl(auVar3,auVar10,auVar4);
        vpermt2d_avx512vl(auVar3,auVar16,auVar4);
        vpshufb_avx2(auVar13,auVar2);
        vpshufb_avx2(auVar13,auVar15);
        auVar16 = vpsrlw_avx2(pauVar8[-2],4);
        auVar16 = vpand_avx2(auVar16,auVar12);
        vpshufb_avx2(auVar13,auVar16);
        auVar16 = vpsrlw_avx2(pauVar8[-1],4);
        auVar10 = vpsrlw_avx2(*pauVar8,4);
        auVar16 = vpand_avx2(auVar16,auVar12);
        auVar10 = vpand_avx2(auVar10,auVar12);
        vpsignb_avx2(auVar11,auVar11);
        vpsignb_avx2(auVar14,auVar11);
        vpshufb_avx2(auVar13,auVar16);
        vpshufb_avx2(auVar13,auVar10);
        halt_baddata();
      }
      auVar2 = vshufps_avx(ZEXT1632(ZEXT816(0) << 0x40),ZEXT1632(ZEXT816(0) << 0x40),0xd8);
      pauVar8 = (undefined1 (*) [32])((long)pauVar8 + uVar5 * 0x90);
      auVar2 = vpermpd_avx2(auVar2,0xd8);
      *(undefined1 (*) [32])(s + uVar6 * uVar7 + uVar9 * 8) = auVar2;
      uVar9 = uVar9 + 1;
    }
    vy = (void *)((long)vy + uVar5 * 0x22);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void gemv<block_q4_0, 8, 8, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_8x8_q8_0(n, s, bs, vx, vy, nr, nc);
}